

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void PreEvaluate(Situation *situation)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  UINT8 *pUVar10;
  int i;
  long lVar11;
  int attackless_pawn_value [256];
  int attacking_pawn_value [256];
  
  memset(attacking_pawn_value,0,0x400);
  memset(attackless_pawn_value,0,0x400);
  pUVar10 = situation->current_pieces;
  iVar8 = 0;
  iVar3 = 0;
  iVar2 = 0;
  iVar5 = 0;
  iVar4 = 0;
  iVar7 = 0;
  iVar6 = 0;
  for (lVar9 = 0; pUVar10 = pUVar10 + 0x10, lVar9 != 2; lVar9 = lVar9 + 1) {
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      uVar1 = (uint)lVar11;
      if (uVar1 - 7 < 2) {
        if (pUVar10[lVar11] != '\0') {
          iVar8 = iVar8 + 1;
          if (lVar9 == 0) {
            iVar5 = iVar5 + 1;
          }
          else {
            iVar4 = iVar4 + 1;
          }
        }
      }
      else if ((uVar1 < 0xb) && ((0x660U >> (uVar1 & 0x1f) & 1) != 0)) {
        if (pUVar10[lVar11] != '\0') {
          iVar3 = iVar3 + 1;
          if (lVar9 == 0) {
            iVar7 = iVar7 + 1;
          }
          else {
            iVar6 = iVar6 + 1;
          }
        }
      }
      else {
        iVar2 = (iVar2 + 1) - (uint)(pUVar10[lVar11] == '\0');
      }
    }
  }
  iVar3 = iVar3 * 3 + iVar2 + iVar8 * 6;
  iVar3 = (0x84 - iVar3) * iVar3;
  iVar2 = iVar3 / 0x42;
  AdvancedValue = (iVar2 * 4 + 2) / 0x42;
  situation->UseBook = 0x103d < iVar3;
  iVar3 = 0x42 - iVar2;
  pUVar10 = "";
  lVar11 = 0x33f8;
  for (lVar9 = 0; lVar9 != 0x400; lVar9 = lVar9 + 4) {
    if (*pUVar10 != '\0') {
      iVar8 = (*(int *)((long)KING_PAWN_ENDGAME_ATTACKING_VALUE + lVar9) * iVar3 +
              *(int *)((long)KING_PAWN_MIDGAME_ATTACKING_VALUE + lVar9) * iVar2) / 0x42;
      *(int *)((long)&ROOK_CANNON_CAN_GET_COL_MASK[9][0x310].no_capture + lVar11) = iVar8;
      *(int *)((long)PiecesValue[0][0] + lVar9) = iVar8;
      iVar8 = (*(int *)((long)HORSE_ENDGAME_VALUE + lVar9) * iVar3 +
              *(int *)((long)HORSE_MIDGAME_VALUE + lVar9) * iVar2) / 0x42;
      *(int *)(ReadInput::s_LineStr + lVar11 + 0x20) = iVar8;
      *(int *)((long)PiecesValue[0][3] + lVar9) = iVar8;
      iVar8 = (*(int *)((long)ROOK_ENDGAME_VALUE + lVar9) * iVar3 +
              *(int *)((long)ROOK_MIDGAME_VALUE + lVar9) * iVar2) / 0x42;
      *(int *)(ReadInput::s_LineStr + lVar11 + 0x420) = iVar8;
      *(int *)((long)PiecesValue[0][4] + lVar9) = iVar8;
      iVar8 = (*(int *)((long)CANNON_ENDGAME_VALUE + lVar9) * iVar3 +
              *(int *)((long)CANNON_MIDGAME_VALUE + lVar9) * iVar2) / 0x42;
      *(int *)((long)PiecesValue[0][0] + lVar11) = iVar8;
      *(int *)((long)PiecesValue[0][5] + lVar9) = iVar8;
      *(undefined4 *)((long)attacking_pawn_value + lVar9) =
           *(undefined4 *)((long)PiecesValue[0][0] + lVar9);
      *(int *)((long)attackless_pawn_value + lVar9) =
           (*(int *)((long)KING_PAWN_ENDGAME_ATTACKLESS_VALUE + lVar9) * iVar3 +
           *(int *)((long)KING_PAWN_MIDGAME_ATTACKLESS_VALUE + lVar9) * iVar2) / 0x42;
    }
    pUVar10 = pUVar10 + 1;
    lVar11 = lVar11 + -4;
  }
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 4) {
    *(int *)((long)HollowThreat + lVar9) =
         (*(int *)((long)HOLLOW_THREAT_VALUE + lVar9) * (iVar2 + 0x42)) / 0x84;
    *(undefined4 *)((long)CentralThreat + lVar9) =
         *(undefined4 *)((long)CENTRAL_THREAT_VALUE + lVar9);
  }
  iVar2 = 0;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    iVar3 = iVar2 + 2;
    if ((char)situation->current_pieces[lVar9 + 0x15] < '\x01') {
      iVar3 = iVar2;
    }
    iVar2 = iVar3;
  }
  for (lVar9 = -7; lVar9 != 0; lVar9 = lVar9 + 1) {
    iVar2 = iVar2 + (uint)('\0' < (char)situation->current_pieces[lVar9 + 0x20]);
  }
  iVar3 = 0;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    iVar8 = iVar3 + 2;
    if (-1 < (char)situation->current_pieces[lVar9 + 0x25]) {
      iVar8 = iVar3;
    }
    iVar3 = iVar8;
  }
  for (lVar9 = -7; lVar9 != 0; lVar9 = lVar9 + 1) {
    iVar3 = iVar3 + (uint)(*(byte *)((long)situation->bit_row + lVar9) >> 7);
  }
  iVar7 = iVar7 + iVar5 * 2;
  iVar6 = iVar6 + iVar4 * 2;
  if (iVar7 - iVar6 == 0 || iVar7 < iVar6) {
    iVar3 = iVar3 + (iVar6 - iVar7) * 2;
  }
  else {
    iVar2 = iVar2 + (iVar7 - iVar6) * 2;
  }
  if (7 < iVar2) {
    iVar2 = 8;
  }
  if (7 < iVar3) {
    iVar3 = 8;
  }
  BlackAdvisorLeakage = iVar2 * 10;
  RedAdvisorLeakage = iVar3 * 10;
  iVar7 = 8 - iVar3;
  iVar6 = 8 - iVar2;
  pUVar10 = "";
  lVar9 = 0x3f8;
  for (lVar11 = 0; lVar11 != 0x400; lVar11 = lVar11 + 4) {
    if (*pUVar10 != '\0') {
      iVar4 = (*(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar11) * iVar7 +
              *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar11) * iVar3) / 8;
      *(int *)((long)PiecesValue[0][2] + lVar11) = iVar4;
      *(int *)((long)PiecesValue[0][1] + lVar11) = iVar4;
      iVar4 = (*(int *)((long)THREATLESS_ADVISOR_BISHOP_VALUE + lVar9) * iVar6 +
              *(int *)((long)THREATENED_ADVISOR_BISHOP_VALUE + lVar9) * iVar2) / 8;
      *(int *)((long)PiecesValue[1][2] + lVar11) = iVar4;
      *(int *)((long)PiecesValue[1][1] + lVar11) = iVar4;
      *(int *)((long)PiecesValue[0][6] + lVar11) =
           (*(int *)((long)attackless_pawn_value + lVar11) * iVar6 +
           *(int *)((long)attacking_pawn_value + lVar11) * iVar2) / 8;
      *(int *)((long)PiecesValue[1][6] + lVar11) =
           (*(int *)((long)attackless_pawn_value + lVar9) * iVar7 +
           *(int *)((long)attacking_pawn_value + lVar9) * iVar3) / 8;
    }
    pUVar10 = pUVar10 + 1;
    lVar9 = lVar9 + -4;
  }
  for (lVar9 = 0; lVar9 != 0x40; lVar9 = lVar9 + 4) {
    *(int *)((long)RedBottomThreat + lVar9) = (*(int *)((long)BOTTOM_THREAT + lVar9) * iVar3) / 8;
    *(int *)((long)BlackBottomThreat + lVar9) = (*(int *)((long)BOTTOM_THREAT + lVar9) * iVar2) / 8;
  }
  iVar7 = iVar7 * 10;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    if ((ulong)situation->current_pieces[lVar9 + 0x10] != 0) {
      iVar7 = iVar7 + PiecesValue[0][PIECE_NUM_TO_TYPE[lVar9 + 0x10]]
                      [situation->current_pieces[lVar9 + 0x10]];
    }
  }
  iVar6 = iVar6 * 10;
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    if ((ulong)situation->current_pieces[lVar9 + 0x20] != 0) {
      iVar6 = iVar6 + *(int *)((long)PIECE_NUM_TO_TYPE[lVar9 + 0x20] * 0x400 + 0x3445c0 +
                              (ulong)situation->current_pieces[lVar9 + 0x20] * 4);
    }
  }
  situation->value[0] = iVar7;
  situation->value[1] = iVar6;
  return;
}

Assistant:

void PreEvaluate(Situation &situation)
{
    int side_tag;                             //用于标志行走方
    int black_value = 0, red_value = 0;       //记录价值
    int red_attacks = 0, black_attacks = 0;   //双方威胁值
    int red_simple_value, black_simple_value; //双方轻子价值
    int midgame_value = 0;
    int attacking_pawn_value[256] = {0}, attackless_pawn_value[256] = {0};

    //首先判断局势处于开中局还是残局阶段，方法是计算各种棋子的数量，按照车=6、马炮=3、其它=1相加。
    //统计三类棋子数量
    int rook_nums = 0, horse_cannon_nums = 0, others_nums = 0;
    int red_rook_nums = 0, black_rook_nums = 0, red_horse_cannon_nums = 0, black_horsecannon_nums = 0;
    for (int r = 0; r < 2; r++)
    {
        side_tag = 16 + (r << 4);
        for (int i = 0; i < 16; i++)
        {
            if (i == 7 || i == 8) //车
            {
                if (situation.current_pieces[side_tag + i])
                {
                    rook_nums++;
                    if (r == 0)
                        red_rook_nums++;
                    else
                        black_rook_nums++;
                }
            }
            else if (i == 5 || i == 6 || i == 9 || i == 10) //马炮
            {
                if (situation.current_pieces[side_tag + i])
                {
                    horse_cannon_nums++;
                    if (r == 0)
                        red_horse_cannon_nums++;
                    else
                        black_horsecannon_nums++;
                }
            }
            else
            {
                if (situation.current_pieces[side_tag + i])
                    others_nums++;
            }
        }
    }
    midgame_value += rook_nums * ROOK_VALUE;
    midgame_value += horse_cannon_nums * HORSE_CANNON_VALUE;
    midgame_value += others_nums * OTHER_VALUE;
    //使用二次函数，子力很少时才认为接近残局
    midgame_value = (2 * TOTAL_MIDGAME_VALUE - midgame_value) * midgame_value / TOTAL_MIDGAME_VALUE;
    AdvancedValue = (TOTAL_AdvancedValue * midgame_value + TOTAL_AdvancedValue / 2) / TOTAL_MIDGAME_VALUE;
    situation.UseBook = midgame_value > 62;
    //计算将车马炮的价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][0][i] = PiecesValue[BLACK][0][254 - i] = ((KING_PAWN_MIDGAME_ATTACKING_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKING_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][3][i] = PiecesValue[BLACK][3][254 - i] = ((HORSE_MIDGAME_VALUE[i] * midgame_value + HORSE_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][4][i] = PiecesValue[BLACK][4][254 - i] = ((ROOK_MIDGAME_VALUE[i] * midgame_value + ROOK_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            PiecesValue[RED][5][i] = PiecesValue[BLACK][5][254 - i] = ((CANNON_MIDGAME_VALUE[i] * midgame_value + CANNON_ENDGAME_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
            attacking_pawn_value[i] = PiecesValue[RED][0][i];
            attackless_pawn_value[i] = ((KING_PAWN_MIDGAME_ATTACKLESS_VALUE[i] * midgame_value + KING_PAWN_ENDGAME_ATTACKLESS_VALUE[i] * (TOTAL_MIDGAME_VALUE - midgame_value)) / TOTAL_MIDGAME_VALUE);
        }
    }

    //计算空头炮和中炮威胁值
    for (int i = 0; i < 16; i++)
    {
        HollowThreat[i] = HOLLOW_THREAT_VALUE[i] * (midgame_value + TOTAL_MIDGAME_VALUE) / (TOTAL_MIDGAME_VALUE * 2);
        CentralThreat[i] = CENTRAL_THREAT_VALUE[i];
    }

    //然后判断各方是否处于进攻状态，方法是计算各种过河棋子的数量，按照车马2炮兵1相加。
    for (int i = 16 + 5; i <= 16 + 8; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks += 2;
    }
    for (int i = 16 + 9; i <= 16 + 15; i++)
    {
        if (situation.current_pieces[i] && BlackHalf(situation.current_pieces[i]))
            red_attacks++;
    }
    for (int i = 32 + 5; i <= 32 + 8; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks += 2;
    }
    for (int i = 32 + 9; i <= 32 + 15; i++)
    {
        if (situation.current_pieces[i] && WhiteHalf(situation.current_pieces[i]))
            black_attacks++;
    }

    //如果本方轻子数比对方多，那么每多一个轻子(车算2个轻子)威胁值加2。威胁值最多不超过8。
    red_simple_value = red_rook_nums * 2 + red_horse_cannon_nums;
    black_simple_value = black_rook_nums * 2 + black_horsecannon_nums;
    if (red_simple_value > black_simple_value)
    {
        red_attacks += (red_simple_value - black_simple_value) * 2;
    }
    else
    {
        black_attacks += (black_simple_value - red_simple_value) * 2;
    }
    red_attacks = std::min(red_attacks, TOTAL_ATTACK_VALUE);
    black_attacks = std::min(black_attacks, TOTAL_ATTACK_VALUE);

    //计算士的缺值
    BlackAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * red_attacks / TOTAL_ATTACK_VALUE;
    RedAdvisorLeakage = TOTAL_ADVISOR_LEAKAGE * black_attacks / TOTAL_ATTACK_VALUE;

    //计算士象兵价值
    for (int i = 0; i < 256; i++)
    {
        if (ON_BOARD[i])
        {
            PiecesValue[RED][1][i] = PiecesValue[RED][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[i] * black_attacks +
                                                                THREATLESS_ADVISOR_BISHOP_VALUE[i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                                               TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][1][i] = PiecesValue[BLACK][2][i] = ((THREATENED_ADVISOR_BISHOP_VALUE[254 - i] * red_attacks +
                                                                    THREATLESS_ADVISOR_BISHOP_VALUE[254 - i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                                                   TOTAL_ATTACK_VALUE);
            PiecesValue[RED][6][i] = ((attacking_pawn_value[i] * red_attacks +
                                       attackless_pawn_value[i] * (TOTAL_ATTACK_VALUE - red_attacks)) /
                                      TOTAL_ATTACK_VALUE);
            PiecesValue[BLACK][6][i] = ((attacking_pawn_value[254 - i] * black_attacks +
                                         attackless_pawn_value[254 - i] * (TOTAL_ATTACK_VALUE - black_attacks)) /
                                        TOTAL_ATTACK_VALUE);
        }
    }

    //计算沉底炮威胁值
    for (int i = 0; i < 16; i++)
    {
        RedBottomThreat[i] = BOTTOM_THREAT[i] * black_attacks / TOTAL_ATTACK_VALUE;
        BlackBottomThreat[i] = BOTTOM_THREAT[i] * red_attacks / TOTAL_ATTACK_VALUE;
    }

    // 调整不受威胁方少掉的仕(士)相(象)分值
    red_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - black_attacks) / TOTAL_ATTACK_VALUE;
    black_value = ADVISOR_BISHOP_ATTACKLESS_VALUE * (TOTAL_ATTACK_VALUE - red_attacks) / TOTAL_ATTACK_VALUE;
    // 最后重新计算子力位置分
    for (int i = 16; i < 32; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            red_value += PiecesValue[RED][PIECE_NUM_TO_TYPE[i]][pos];
    }
    for (int i = 32; i < 48; i++)
    {
        int pos = situation.current_pieces[i];
        if (pos)
            black_value += PiecesValue[BLACK][PIECE_NUM_TO_TYPE[i]][pos];
    }

    situation.value[RED] = red_value;
    situation.value[BLACK] = black_value;
}